

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

bool __thiscall
wallet::DescriptorScriptPubKeyMan::SetupDescriptorGeneration
          (DescriptorScriptPubKeyMan *this,WalletBatch *batch,CExtKey *master_key,
          OutputType addr_type,bool internal)

{
  WalletStorage *pWVar1;
  element_type *peVar2;
  bool bVar3;
  int iVar4;
  runtime_error *prVar5;
  long in_FS_OFFSET;
  allocator<char> local_1b5;
  OutputType addr_type_local;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock62;
  CExtPubKey local_1a0;
  WalletDescriptor local_128;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  addr_type_local = addr_type;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock62,&this->cs_desc_man,"cs_desc_man",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0x92c,false);
  pWVar1 = (this->super_ScriptPubKeyMan).m_storage;
  iVar4 = (*pWVar1->_vptr_WalletStorage[4])(pWVar1,0x400000000);
  if ((char)iVar4 == '\0') {
    __assert_fail("m_storage.IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0x92d,
                  "bool wallet::DescriptorScriptPubKeyMan::SetupDescriptorGeneration(WalletBatch &, const CExtKey &, OutputType, bool)"
                 );
  }
  peVar2 = (this->m_wallet_descriptor).descriptor.
           super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 == (element_type *)0x0) {
    CExtKey::Neuter(&local_1a0,master_key);
    GenerateWalletDescriptor(&local_128,&local_1a0,&addr_type_local,internal);
    WalletDescriptor::operator=(&this->m_wallet_descriptor,&local_128);
    WalletDescriptor::~WalletDescriptor(&local_128);
    CKey::GetPubKey((CPubKey *)&local_128,&master_key->key);
    bVar3 = AddDescriptorKeyWithDB(this,batch,&master_key->key,(CPubKey *)&local_128);
    if (!bVar3) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a0,"SetupDescriptorGeneration",&local_1b5);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_128
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_1a0,": writing descriptor master private key failed");
      std::runtime_error::runtime_error(prVar5,(string *)&local_128);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00432293;
    }
    (*(this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1a])(&local_128,this);
    bVar3 = WalletBatch::WriteDescriptor(batch,(uint256 *)&local_128,&this->m_wallet_descriptor);
    if (!bVar3) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a0,"SetupDescriptorGeneration",&local_1b5);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_128
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_1a0,": writing descriptor failed");
      std::runtime_error::runtime_error(prVar5,(string *)&local_128);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00432293;
    }
    TopUpWithDB(this,batch,0);
    pWVar1 = (this->super_ScriptPubKeyMan).m_storage;
    (*pWVar1->_vptr_WalletStorage[5])(pWVar1,batch);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock62.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return peVar2 == (element_type *)0x0;
  }
LAB_00432293:
  __stack_chk_fail();
}

Assistant:

bool DescriptorScriptPubKeyMan::SetupDescriptorGeneration(WalletBatch& batch, const CExtKey& master_key, OutputType addr_type, bool internal)
{
    LOCK(cs_desc_man);
    assert(m_storage.IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS));

    // Ignore when there is already a descriptor
    if (m_wallet_descriptor.descriptor) {
        return false;
    }

    m_wallet_descriptor = GenerateWalletDescriptor(master_key.Neuter(), addr_type, internal);

    // Store the master private key, and descriptor
    if (!AddDescriptorKeyWithDB(batch, master_key.key, master_key.key.GetPubKey())) {
        throw std::runtime_error(std::string(__func__) + ": writing descriptor master private key failed");
    }
    if (!batch.WriteDescriptor(GetID(), m_wallet_descriptor)) {
        throw std::runtime_error(std::string(__func__) + ": writing descriptor failed");
    }

    // TopUp
    TopUpWithDB(batch);

    m_storage.UnsetBlankWalletFlag(batch);
    return true;
}